

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Warn.cpp
# Opt level: O2

void __thiscall
WarnIRCCommand::trigger
          (WarnIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  long lVar1;
  int iVar2;
  long lVar3;
  undefined8 *puVar4;
  Config *this_00;
  undefined8 uVar5;
  long lVar6;
  uint __val;
  long *plVar7;
  string_view in_key;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 uVar8;
  string local_e8;
  IRC_Bot *local_c8;
  size_t local_c0;
  char *local_b8;
  char *local_b0;
  size_t local_a8;
  char *local_a0;
  size_t local_98;
  long *local_90;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parameters_split;
  string local_50;
  
  local_e8._M_dataplus._M_p = (pointer)parameters._M_len;
  local_e8._M_string_length = (size_type)parameters._M_str;
  local_88._M_len = 2;
  local_88._M_str = " \t";
  jessilib::
  word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&parameters_split,(basic_string_view<char,_std::char_traits<char>_> *)&local_e8,
             &local_88);
  if (parameters_split.second._M_len == 0) {
    Jupiter::IRC::Client::sendNotice
              (source,nick._M_len,nick._M_str,0x39,
               "Error: Too Few Parameters. Syntax: Warn <Player> <Reason>");
  }
  else {
    lVar3 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
    if (lVar3 != 0) {
      local_c8 = source;
      local_c0 = nick._M_len;
      local_b8 = nick._M_str;
      RenX::getCore();
      Jupiter::IRC::Client::Channel::getType();
      RenX::Core::getServers((int)&local_88);
      local_90 = (long *)local_88._M_str;
      if ((char *)local_88._M_len == local_88._M_str) {
        Jupiter::IRC::Client::sendMessage
                  (local_c8,channel._M_len,channel._M_str,0x40,
                   "Error: Channel not attached to any connected Renegade X servers.");
      }
      else {
        local_98 = parameters_split.first._M_len;
        local_a0 = parameters_split.first._M_str;
        local_a8 = parameters_split.second._M_len;
        local_b0 = parameters_split.second._M_str;
        for (plVar7 = (long *)local_88._M_len; plVar7 != local_90; plVar7 = plVar7 + 1) {
          if (*plVar7 != 0) {
            lVar3 = RenX::Server::getPlayerByPartName(*plVar7,local_98,local_a0);
            if (lVar3 != 0) {
              puVar4 = (undefined8 *)Jupiter::Plugin::getName_abi_cxx11_();
              this_00 = (Config *)Jupiter::Config::operator[](lVar3 + 0x1b8,puVar4[1],*puVar4);
              in_key._M_str = "w";
              in_key._M_len = 1;
              iVar2 = Jupiter::Config::get<int>(this_00,in_key,0);
              uVar8 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
              __val = iVar2 + 1;
              if (iVar2 < pluginInstance.m_maxWarns) {
                puVar4 = (undefined8 *)Jupiter::Plugin::getName_abi_cxx11_();
                uVar5 = Jupiter::Config::operator[](lVar3 + 0x1b8,puVar4[1],*puVar4);
                std::__cxx11::to_string(&local_50,__val);
                Jupiter::Config::set(uVar5,1,"w",&local_50);
                std::__cxx11::string::~string((string *)&local_50);
                lVar1 = *plVar7;
                in_stack_ffffffffffffff08 = CONCAT44(uVar8,__val);
                string_printf_abi_cxx11_
                          (&local_e8,
                           "You have been warned by %.*s@IRC for: %.*s. You have %d warnings.",
                           local_c0,local_b8,local_a8,local_b0,in_stack_ffffffffffffff08);
                RenX::Server::sendWarnMessage
                          (lVar1,lVar3,local_e8._M_string_length,local_e8._M_dataplus._M_p);
                std::__cxx11::string::~string((string *)&local_e8);
                string_printf_abi_cxx11_
                          (&local_e8,"%.*s has been warned; they now have %d warnings.",
                           *(undefined8 *)(lVar3 + 0x10),*(undefined8 *)(lVar3 + 8),(ulong)__val);
                Jupiter::IRC::Client::sendNotice
                          (local_c8,local_c0,local_b8,local_e8._M_string_length,
                           local_e8._M_dataplus._M_p);
              }
              else {
                lVar1 = *plVar7;
                if (pluginInstance.m_warnAction == -1) {
                  string_printf_abi_cxx11_
                            (&local_e8,"Warning limit reached (%d warnings)",(ulong)__val);
                  RenX::Server::kickPlayer
                            (lVar1,lVar3,local_e8._M_string_length,local_e8._M_dataplus._M_p);
                  std::__cxx11::string::~string((string *)&local_e8);
                  string_printf_abi_cxx11_
                            (&local_e8,
                             "%.*s has been kicked from the server for exceeding the warning limit (%d warnings)."
                             ,*(undefined8 *)(lVar3 + 0x10),*(undefined8 *)(lVar3 + 8),(ulong)__val)
                  ;
                  Jupiter::IRC::Client::sendNotice
                            (local_c8,local_c0,local_b8,local_e8._M_string_length,
                             local_e8._M_dataplus._M_p);
                }
                else {
                  string_printf_abi_cxx11_
                            (&local_e8,"Warning limit reached (%d warnings)",(ulong)__val);
                  lVar6 = (long)pluginInstance.m_warnAction;
                  RenX::Server::banPlayer
                            (lVar1,lVar3,0x15,"Jupiter Bot/RenX.Warn",local_e8._M_string_length,
                             local_e8._M_dataplus._M_p,lVar6);
                  uVar8 = (undefined4)((ulong)lVar6 >> 0x20);
                  std::__cxx11::string::~string((string *)&local_e8);
                  in_stack_ffffffffffffff08 = CONCAT44(uVar8,__val);
                  string_printf_abi_cxx11_
                            (&local_e8,
                             "%.*s has been banned from the server for exceeding the warning limit (%d warnings)."
                             ,*(undefined8 *)(lVar3 + 0x10),*(undefined8 *)(lVar3 + 8),local_a8,
                             local_b0,in_stack_ffffffffffffff08);
                  Jupiter::IRC::Client::sendNotice
                            (local_c8,local_c0,local_b8,local_e8._M_string_length,
                             local_e8._M_dataplus._M_p);
                }
              }
              std::__cxx11::string::~string((string *)&local_e8);
            }
          }
        }
      }
      std::_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~_Vector_base
                ((_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&local_88);
    }
  }
  return;
}

Assistant:

void WarnIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	auto parameters_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (parameters_split.second.empty()) {
		source->sendNotice(nick, "Error: Too Few Parameters. Syntax: Warn <Player> <Reason>"sv);
		return;
	}

	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(chan->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	std::string_view name = parameters_split.first;
	std::string_view reason = parameters_split.second;

	RenX::PlayerInfo *player;
	for (const auto& server : servers) {
		if (server != nullptr) {
			player = server->getPlayerByPartName(name);
			if (player != nullptr) {
				int warns = player->varData[pluginInstance.getName()].get<int>(WARNS_KEY) + 1;
				if (warns > pluginInstance.m_maxWarns) {
					switch (pluginInstance.m_warnAction) {
					case -1:
						server->kickPlayer(*player, string_printf("Warning limit reached (%d warnings)", warns));
						source->sendNotice(nick, string_printf("%.*s has been kicked from the server for exceeding the warning limit (%d warnings).", player->name.size(), player->name.data(), warns));
						break;
					default:
						server->banPlayer(*player, "Jupiter Bot/RenX.Warn"sv, string_printf("Warning limit reached (%d warnings)", warns), std::chrono::seconds(pluginInstance.m_warnAction));
						source->sendNotice(nick, string_printf("%.*s has been banned from the server for exceeding the warning limit (%d warnings).", player->name.size(), player->name.data(), reason.size(), reason.data(), warns));
						break;
					}
				}
				else {
					player->varData[pluginInstance.getName()].set(WARNS_KEY, std::to_string(warns));
					server->sendWarnMessage(*player, string_printf("You have been warned by %.*s@IRC for: %.*s. You have %d warnings.", nick.size(),
						nick.data(), reason.size(), reason.data(), warns));
					source->sendNotice(nick, string_printf("%.*s has been warned; they now have %d warnings.", player->name.size(), player->name.data(), warns));
				}
			}
		}
	}
}